

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS
ref_geom_bspline_row_tec(REF_INT degree,REF_INT n_control_point,REF_DBL *knots,char *filename)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  FILE *__stream;
  REF_DBL *N_00;
  double t_00;
  REF_STATUS ref_private_macro_code_rss;
  FILE *file;
  REF_DBL *N;
  REF_DBL s1;
  REF_DBL s0;
  REF_DBL t1;
  REF_DBL t0;
  REF_DBL t;
  REF_INT j;
  REF_INT n;
  REF_INT i;
  char *filename_local;
  REF_DBL *knots_local;
  REF_INT n_control_point_local;
  REF_INT degree_local;
  
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x10d2,
           "ref_geom_bspline_row_tec","unable to open file");
    n_control_point_local = 2;
  }
  else {
    fprintf(__stream,"title=\"refine bspine basis\"\n");
    fprintf(__stream,"variables = \"t\"");
    for (t._4_4_ = 0; (int)t._4_4_ < n_control_point; t._4_4_ = t._4_4_ + 1) {
      fprintf(__stream," \"N%d,%d\"",(ulong)t._4_4_,(ulong)(uint)degree);
    }
    fprintf(__stream,"\n");
    fprintf(__stream,"zone t=\"basis\", i=%d, datapacking=%s\n",0x3e9,"point");
    if (n_control_point < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x10dc
             ,"ref_geom_bspline_row_tec","malloc N of REF_DBL negative");
      n_control_point_local = 1;
    }
    else {
      N_00 = (REF_DBL *)malloc((long)n_control_point << 3);
      if (N_00 == (REF_DBL *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x10dc,"ref_geom_bspline_row_tec","malloc N of REF_DBL NULL");
        n_control_point_local = 2;
      }
      else {
        dVar1 = knots[degree];
        dVar2 = knots[degree + n_control_point + -1];
        for (j = 0; j < 0x3e9; j = j + 1) {
          t_00 = (1.0 - (double)j / 1000.0) * dVar1 + ((double)j / 1000.0) * dVar2;
          fprintf(__stream," %f",t_00);
          uVar3 = ref_geom_bspline_row(degree,n_control_point,knots,t_00,N_00);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x10e4,"ref_geom_bspline_row_tec",(ulong)uVar3,"eval");
            return uVar3;
          }
          for (t._4_4_ = 0; (int)t._4_4_ < n_control_point; t._4_4_ = t._4_4_ + 1) {
            fprintf(__stream," %f",N_00[(int)t._4_4_]);
          }
          fprintf(__stream,"\n");
        }
        if (N_00 != (REF_DBL *)0x0) {
          free(N_00);
        }
        fclose(__stream);
        n_control_point_local = 0;
      }
    }
  }
  return n_control_point_local;
}

Assistant:

REF_FCN REF_STATUS ref_geom_bspline_row_tec(REF_INT degree,
                                            REF_INT n_control_point,
                                            REF_DBL *knots,
                                            const char *filename) {
  REF_INT i, n = 1001, j;
  REF_DBL t, t0, t1, s0, s1;
  REF_DBL *N;
  FILE *file;

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  fprintf(file, "title=\"refine bspine basis\"\n");
  fprintf(file, "variables = \"t\"");
  for (j = 0; j < n_control_point; j++) {
    fprintf(file, " \"N%d,%d\"", j, degree);
  }
  fprintf(file, "\n");
  fprintf(file, "zone t=\"basis\", i=%d, datapacking=%s\n", n, "point");

  ref_malloc(N, n_control_point, REF_DBL);
  t0 = knots[degree];
  t1 = knots[degree + n_control_point - 1];
  for (i = 0; i < n; i++) {
    s1 = ((REF_DBL)i) / ((REF_DBL)(n - 1));
    s0 = 1.0 - s1;
    t = s0 * t0 + s1 * t1;
    fprintf(file, " %f", t);
    RSS(ref_geom_bspline_row(degree, n_control_point, knots, t, N), "eval");
    for (j = 0; j < n_control_point; j++) {
      fprintf(file, " %f", N[j]);
    }
    fprintf(file, "\n");
  }
  ref_free(N);
  fclose(file);
  return REF_SUCCESS;
}